

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasCordFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  CppType CVar2;
  CType CVar3;
  long lVar4;
  long lVar5;
  int i;
  long lVar6;
  
  lVar5 = 0;
  lVar6 = 0;
  while( true ) {
    if (*(int *)(descriptor + 4) <= lVar6) {
      lVar5 = -1;
      lVar6 = 0;
      do {
        lVar4 = (long)*(int *)(descriptor + 0x70);
        lVar5 = lVar5 + 1;
        if (lVar4 <= lVar5) {
          return lVar5 < lVar4;
        }
        bVar1 = HasCordFields((Descriptor *)(lVar6 + *(long *)(descriptor + 0x38)),options);
        lVar6 = lVar6 + 0x88;
      } while (!bVar1);
      return lVar5 < lVar4;
    }
    lVar4 = *(long *)(descriptor + 0x28);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)(lVar4 + lVar5));
    if ((CVar2 == CPPTYPE_STRING) &&
       (CVar3 = EffectiveStringCType((FieldDescriptor *)(lVar4 + lVar5),options),
       CVar3 == FieldOptions_CType_CORD)) break;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x48;
  }
  return true;
}

Assistant:

static bool HasCordFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsCordField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasCordFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}